

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

tuple<SudokuGitter,_SudokuGitter> *
mainBigSudoku(tuple<SudokuGitter,_SudokuGitter> *__return_storage_ptr__,int elements)

{
  __tuple_element_t<0UL,_tuple<SudokuGitter,_SudokuGitter>_> *p_Var1;
  __tuple_element_t<1UL,_tuple<SudokuGitter,_SudokuGitter>_> *p_Var2;
  tuple<SudokuGitter,_SudokuGitter> local_168;
  SudokuGitter local_118;
  SudokuGitter local_f0;
  undefined1 local_c8 [8];
  SudokuGitter gitter2;
  SudokuGitter gitter1;
  undefined1 local_60 [8];
  SudokuGenerator generator;
  int elements_local;
  tuple<SudokuGitter,_SudokuGitter> *bigGitter;
  
  generator.gitter._36_4_ = elements;
  SudokuGenerator::SudokuGenerator((SudokuGenerator *)local_60,elements);
  SudokuGenerator::generateNewBig(__return_storage_ptr__,(SudokuGenerator *)local_60);
  p_Var1 = std::get<0ul,SudokuGitter,SudokuGitter>(__return_storage_ptr__);
  SudokuGitter::SudokuGitter((SudokuGitter *)&gitter2.quadHeight,p_Var1);
  p_Var2 = std::get<1ul,SudokuGitter,SudokuGitter>(__return_storage_ptr__);
  SudokuGitter::SudokuGitter((SudokuGitter *)local_c8,p_Var2);
  SudokuGitter::getSolvable(&local_f0,(SudokuGitter *)&gitter2.quadHeight);
  SudokuGitter::operator=((SudokuGitter *)&gitter2.quadHeight,&local_f0);
  SudokuGitter::~SudokuGitter(&local_f0);
  SudokuGitter::getSolvable(&local_118,(SudokuGitter *)local_c8);
  SudokuGitter::operator=((SudokuGitter *)local_c8,&local_118);
  SudokuGitter::~SudokuGitter(&local_118);
  std::make_tuple<SudokuGitter&,SudokuGitter&>
            (&local_168,(SudokuGitter *)&gitter2.quadHeight,(SudokuGitter *)local_c8);
  std::tuple<SudokuGitter,_SudokuGitter>::operator=(__return_storage_ptr__,&local_168);
  std::tuple<SudokuGitter,_SudokuGitter>::~tuple(&local_168);
  SudokuGitter::~SudokuGitter((SudokuGitter *)local_c8);
  SudokuGitter::~SudokuGitter((SudokuGitter *)&gitter2.quadHeight);
  SudokuGenerator::~SudokuGenerator((SudokuGenerator *)local_60);
  return __return_storage_ptr__;
}

Assistant:

tuple<SudokuGitter, SudokuGitter> mainBigSudoku(int elements){
    SudokuGenerator generator = SudokuGenerator(elements);
    tuple<SudokuGitter, SudokuGitter> bigGitter = generator.generateNewBig();
    SudokuGitter gitter1 = std::get<0>(bigGitter);
    SudokuGitter gitter2 = std::get<1>(bigGitter);
    gitter1 = gitter1.getSolvable();
    gitter2 = gitter2.getSolvable();
    bigGitter = std::make_tuple(gitter1, gitter2);
    return bigGitter;
}